

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O0

cmList * __thiscall
cmList::transform(cmList *this,TransformAction action,string *arg,
                 unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
                 *selector)

{
  pointer pAVar1;
  pointer pTVar2;
  pointer pTVar3;
  type pTVar4;
  anon_class_8_1_70dd1d2d local_58;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_50;
  _Rb_tree_const_iterator<(anonymous_namespace)::ActionDescriptor> local_30;
  iterator descriptor;
  unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
  *selector_local;
  string *arg_local;
  TransformAction action_local;
  cmList *this_local;
  
  descriptor._M_node = (_Base_ptr)selector;
  local_30._M_node = (_Base_ptr)anon_unknown.dwarf_66ad7c::TransformConfigure(action,selector,1);
  pAVar1 = std::_Rb_tree_const_iterator<(anonymous_namespace)::ActionDescriptor>::operator->
                     (&local_30);
  pTVar2 = std::
           unique_ptr<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
           ::operator->(&pAVar1->Transform);
  pTVar3 = std::
           unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>::
           get(selector);
  (*pTVar2->_vptr_TransformAction[2])(pTVar2,pTVar3,arg);
  pTVar4 = std::
           unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>::
           operator*(selector);
  local_58.descriptor = &local_30;
  std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
  function<cmList::transform(cmList::TransformAction,std::__cxx11::string_const&,std::unique_ptr<cmList::TransformSelector,std::default_delete<cmList::TransformSelector>>)::__0,void>
            ((function<std::__cxx11::string(std::__cxx11::string_const&)> *)&local_50,&local_58);
  (*pTVar4->_vptr_TransformSelector[5])(pTVar4,this,&local_50);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_50);
  return this;
}

Assistant:

cmList& cmList::transform(TransformAction action, std::string const& arg,
                          std::unique_ptr<TransformSelector> selector)
{
  auto descriptor = TransformConfigure(action, selector, 1);

  descriptor->Transform->Initialize(
    static_cast<::TransformSelector*>(selector.get()), arg);

  static_cast<::TransformSelector&>(*selector).Transform(
    this->Values, [&descriptor](const std::string& s) -> std::string {
      return (*descriptor->Transform)(s);
    });

  return *this;
}